

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::predict_or_learn_bag<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  vector<float,_std::allocator<float>_> *this;
  polyprediction *this_00;
  uint uVar1;
  pointer ppeVar2;
  example *peVar3;
  pointer pfVar4;
  float *pfVar5;
  size_t i_3;
  float *pfVar6;
  size_t sVar7;
  ulong uVar8;
  size_t i_1;
  size_t sVar9;
  uint32_t i_2;
  cb_explore_adf *pcVar10;
  uint32_t i;
  int iVar11;
  v_array<ACTION_SCORE::action_score> *__range3;
  action_score local_90;
  ulong local_88;
  multi_ex *local_80;
  cb_explore_adf *local_78;
  score_iterator local_70;
  score_iterator local_60;
  score_iterator local_50;
  score_iterator local_40;
  
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  peVar3 = *ppeVar2;
  this_00 = &peVar3->pred;
  local_88 = (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3;
  local_80 = examples;
  local_78 = (cb_explore_adf *)base;
  if ((int)local_88 != 0) {
    uVar8 = local_88 & 0xffffffff;
    pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar4) {
      (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar4;
    }
    while (iVar11 = (int)uVar8, uVar8 = (ulong)(iVar11 - 1), iVar11 != 0) {
      local_90.action = 0;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&data->scores,(float *)&local_90);
    }
    this = &data->top_actions;
    local_88 = local_88 & 0xffffffff;
    local_90.action = 0;
    std::vector<float,_std::allocator<float>_>::_M_fill_assign
              (this,local_88,(value_type_conflict3 *)&local_90);
    test_adf_sequence(local_80);
    for (uVar8 = 0; uVar8 < data->bag_size; uVar8 = (ulong)((uint32_t)uVar8 + 1)) {
      pcVar10 = local_78;
      LEARNER::multiline_learn_or_predict<false>
                ((multi_learner *)local_78,local_80,data->offset,(uint32_t)uVar8);
      pfVar5 = (peVar3->pred).scalars._end;
      for (pfVar6 = (peVar3->pred).scalars._begin; pfVar6 != pfVar5; pfVar6 = pfVar6 + 2) {
        pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar4[(uint)*pfVar6] = pfVar6[1] + pfVar4[(uint)*pfVar6];
      }
      if (data->first_only == false) {
        sVar7 = fill_tied(pcVar10,(v_array<ACTION_SCORE::action_score> *)&this_00->scalars);
        for (sVar9 = 0; sVar7 != sVar9; sVar9 = sVar9 + 1) {
          uVar1 = (this_00->a_s)._begin[sVar9].action;
          pfVar4 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar4[uVar1] = pfVar4[uVar1] + 1.0 / (float)sVar7;
        }
      }
      else {
        uVar1 = ((this_00->a_s)._begin)->action;
        pfVar4 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar4[uVar1] = pfVar4[uVar1] + 1.0;
      }
    }
    v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)(data->scores).super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(data->scores).super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2);
        uVar8 = (ulong)((uint32_t)uVar8 + 1)) {
      local_90.score = 0.0;
      local_90.action = (uint32_t)uVar8;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,&local_90);
    }
    local_40._p = (data->action_probs)._begin;
    local_40._vptr_score_iterator =
         (_func_int **)
         &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
    local_50._p = (data->action_probs)._end;
    local_50._vptr_score_iterator =
         (_func_int **)
         &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
    exploration::
    generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
              ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
               (data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
               (data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_40,&local_50);
    local_60._p = (data->action_probs)._begin;
    local_60._vptr_score_iterator =
         (_func_int **)
         &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
    local_70._p = (data->action_probs)._end;
    local_70._vptr_score_iterator =
         (_func_int **)
         &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
    exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
              (data->epsilon,true,&local_60,&local_70);
    do_sort(data);
    for (uVar8 = 0; local_88 != uVar8; uVar8 = uVar8 + 1) {
      (this_00->a_s)._begin[uVar8] = (data->action_probs)._begin[uVar8];
    }
    return;
  }
  v_array<ACTION_SCORE::action_score>::clear
            ((v_array<ACTION_SCORE::action_score> *)&this_00->scalars);
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)examples.size();
  if (num_actions == 0)
  {
    preds.clear();
    return;
  }

  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(0.f);
  vector<float>& top_actions = data.top_actions;
  top_actions.assign(num_actions, 0);
  bool test_sequence = test_adf_sequence(examples) == nullptr;
  for (uint32_t i = 0; i < data.bag_size; i++)
  {
    // avoid updates to the random num generator
    // for greedify, always update first policy once
    uint32_t count = is_learn ? ((data.greedify && i == 0) ? 1 : BS::weight_gen(*data.all)) : 0;

    if (is_learn && count > 0 && !test_sequence)
      multiline_learn_or_predict<true>(base, examples, data.offset, i);
    else
      multiline_learn_or_predict<false>(base, examples, data.offset, i);

    assert(preds.size() == num_actions);
    for (auto e : preds) data.scores[e.action] += e.score;

    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      for (size_t i = 0; i < tied_actions; ++i) top_actions[preds[i].action] += 1.f / tied_actions;
    }
    else
      top_actions[preds[0].action] += 1.f;
    if (is_learn && !test_sequence)
      for (uint32_t j = 1; j < count; j++) multiline_learn_or_predict<true>(base, examples, data.offset, i);
  }

  data.action_probs.clear();
  for (uint32_t i = 0; i < data.scores.size(); i++) data.action_probs.push_back({i, 0.});

  // generate distribution over actions
  generate_bag(
      begin(data.top_actions), end(data.top_actions), begin_scores(data.action_probs), end_scores(data.action_probs));

  enforce_minimum_probability(data.epsilon, true, begin_scores(data.action_probs), end_scores(data.action_probs));

  do_sort(data);

  for (size_t i = 0; i < num_actions; i++) preds[i] = data.action_probs[i];
}